

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_heat_maps.h
# Opt level: O2

double __thiscall
Gudhi::Persistence_representations::
Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
compute_scalar_product
          (Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>
           *this,Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>
                 *second)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  pointer pvVar5;
  long lVar6;
  pointer ppVar7;
  bool bVar8;
  ulong uVar9;
  undefined8 *puVar10;
  ulong uVar11;
  long lVar12;
  size_t j;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  double dVar16;
  pair<double,_double> __args;
  pair<double,_double> __args_1;
  double local_58;
  
  if (this->discrete == true) {
    bVar8 = check_if_the_same(this,second);
    if (!bVar8) {
      std::operator<<((ostream *)&std::cerr,
                      "The persistence images are of non compatible sizes. We cannot therefore compute distance between them. The program will now terminate"
                     );
      puVar10 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar10 = 
      "The persistence images are of non compatible sizes. The program will now terminate";
      __cxa_throw(puVar10,&char_const*::typeinfo,0);
    }
    pvVar5 = (this->heat_map).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_58 = 0.0;
    for (lVar12 = 0;
        lVar12 != ((long)(this->heat_map).
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar5) / 0x18;
        lVar12 = lVar12 + 1) {
      lVar6 = *(long *)&pvVar5[lVar12].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data;
      for (lVar13 = 0;
          (long)*(pointer *)
                 ((long)&pvVar5[lVar12].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data + 8) - lVar6 >> 3 != lVar13; lVar13 = lVar13 + 1) {
        local_58 = local_58 +
                   *(double *)(lVar6 + lVar13 * 8) *
                   *(double *)
                    (*(long *)&(second->heat_map).
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[lVar12].
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data + lVar13 * 8);
      }
    }
  }
  else {
    uVar9 = (ulong)((long)(this->interval).
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->interval).
                         super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 4;
    uVar14 = (ulong)((long)(second->interval).
                           super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(second->interval).
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 4;
    uVar11 = 0;
    uVar15 = uVar14 & 0xffffffff;
    if ((int)uVar14 < 1) {
      uVar15 = uVar11;
    }
    uVar14 = uVar9 & 0xffffffff;
    if ((int)uVar9 < 1) {
      uVar14 = uVar11;
    }
    local_58 = 0.0;
    for (; uVar11 != uVar14; uVar11 = uVar11 + 1) {
      ppVar7 = (this->interval).
               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      dVar1 = ppVar7[uVar11].first;
      dVar2 = ppVar7[uVar11].second;
      for (lVar12 = 0; uVar15 * 8 != lVar12; lVar12 = lVar12 + 8) {
        ppVar7 = (second->interval).
                 super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        dVar3 = (this->weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar11];
        dVar4 = *(double *)
                 ((long)(second->weights).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start + lVar12);
        __args.second = dVar2;
        __args.first = dVar1;
        __args_1.second = *(double *)((long)&ppVar7->second + lVar12 * 2);
        __args_1.first = *(double *)((long)&ppVar7->first + lVar12 * 2);
        dVar16 = std::function<double_(std::pair<double,_double>,_std::pair<double,_double>)>::
                 operator()(&this->kernel,__args,__args_1);
        local_58 = local_58 + dVar16 * dVar3 * dVar4;
      }
    }
  }
  return local_58;
}

Assistant:

double Persistence_heat_maps<Scalling_of_kernels>::compute_scalar_product(const Persistence_heat_maps& second) const {
  if (discrete) {
    // first we need to check if (*this) and second are defined on the same domain and have the same dimensions:
    if (!this->check_if_the_same(second)) {
      std::cerr << "The persistence images are of non compatible sizes. We cannot therefore compute distance between "
                   "them. The program will now terminate";
      throw "The persistence images are of non compatible sizes. The program will now terminate";
    }

    // if we are here, we know that the two persistence images are defined on the same domain, so we can start computing
    // their scalar product:
    double scalar_prod = 0;
    for (size_t i = 0; i != this->heat_map.size(); ++i) {
      for (size_t j = 0; j != this->heat_map[i].size(); ++j) {
        scalar_prod += this->heat_map[i][j] * second.heat_map[i][j];
      }
    }
    return scalar_prod;
  } else {
    int num_pts1 = this->interval.size();
    int num_pts2 = second.interval.size();
    double kernel_val = 0;
    for (int i = 0; i < num_pts1; i++) {
      std::pair<double, double> pi = this->interval[i];
      for (int j = 0; j < num_pts2; j++) {
        std::pair<double, double> pj = second.interval[j];
        kernel_val += this->weights[i] * second.weights[j] * this->kernel(pi, pj);
      }
    }
    return kernel_val;
  }
}